

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void increase_score(tgestate_t *state,uint8_t delta)

{
  char in_SIL;
  long in_RDI;
  char *tmp;
  char *pdigit;
  char *local_18;
  uint7 in_stack_fffffffffffffff0;
  
  local_18 = (char *)(in_RDI + 0x6ed);
  do {
    while (*local_18 = *local_18 + '\x01', '\t' < *local_18) {
      *local_18 = '\0';
      local_18 = local_18 + -1;
    }
    in_SIL = in_SIL + -1;
    local_18 = (char *)(in_RDI + 0x6ed);
  } while (in_SIL != '\0');
  plot_score((tgestate_t *)(ulong)in_stack_fffffffffffffff0);
  return;
}

Assistant:

void increase_score(tgestate_t *state, uint8_t delta)
{
  char *pdigit; /* was HL */

  assert(state != NULL);
  assert(delta > 0);

  /* Increment the score digit-wise until delta is zero. */

  assert(state->score_digits[0] <= 9);
  assert(state->score_digits[1] <= 9);
  assert(state->score_digits[2] <= 9);
  assert(state->score_digits[3] <= 9);
  assert(state->score_digits[4] <= 9);

  pdigit = &state->score_digits[4];
  do
  {
    char *tmp; /* was HL */

    tmp = pdigit;
    for (;;)
    {
      (*pdigit)++;
      if (*pdigit < 10)
        break;

      *pdigit-- = 0;
    }
    pdigit = tmp;
  }
  while (--delta);

  plot_score(state);
}